

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O2

bool __thiscall
Js::AsmJsByteCodeWriter::TryWriteAsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
          (AsmJsByteCodeWriter *this,OpCodeAsmJs op,RegSlot value,uint32 slotIndex,uint8 dataWidth,
          ViewType viewType,uint32 offset)

{
  uint32 local_16;
  RegSlot local_12;
  OpLayoutT_AsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> layout;
  
  layout._2_4_ = offset;
  local_16 = slotIndex;
  local_12 = value;
  layout.SlotIndex._0_1_ = viewType;
  layout.SlotIndex._1_1_ = dataWidth;
  ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)2>
            (&(this->super_ByteCodeWriter).m_byteCodeData,op,&local_16,0xe,
             &this->super_ByteCodeWriter,false);
  return true;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteAsmSimdTypedArr(OpCodeAsmJs op, RegSlot value, uint32 slotIndex, uint8 dataWidth, ArrayBufferView::ViewType viewType, uint32 offset)
    {
        OpLayoutT_AsmSimdTypedArr<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Value, value) && SizePolicy::template Assign<ArrayBufferView::ViewType>(layout.ViewType, viewType)
            && SizePolicy::Assign(layout.SlotIndex, slotIndex) && SizePolicy::template Assign<int8>(layout.DataWidth, dataWidth) && SizePolicy::Assign(layout.Offset, offset))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }